

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxiliaryMemorySwitches.hpp
# Opt level: O0

void __thiscall
Apple::II::
AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_false>_>
::set_card_paging(AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_false>_>
                  *this)

{
  bool bVar1;
  byte local_21;
  CardState local_14;
  AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_false>_>
  *pAStack_10;
  CardState previous_state;
  AuxiliaryMemorySwitches<Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_false>_>
  *this_local;
  
  local_14 = this->card_state_;
  bVar1 = (this->switches_).internal_CX_rom;
  (this->card_state_).region_C4_C8 = (bool)(bVar1 & 1);
  (this->card_state_).region_C1_C3 = (bool)(bVar1 & 1);
  if ((((this->switches_).internal_CX_rom & 1U) == 0) && (((this->switches_).slot_C3_rom & 1U) == 0)
     ) {
    (this->card_state_).region_C3 = true;
  }
  else {
    (this->card_state_).region_C3 = (bool)((this->card_state_).region_C1_C3 & 1);
  }
  local_21 = 1;
  if (((this->switches_).internal_CX_rom & 1U) == 0) {
    local_21 = (this->switches_).internal_C8_rom;
  }
  (this->card_state_).region_C8_D0 = (bool)(local_21 & 1);
  pAStack_10 = this;
  bVar1 = CardState::operator!=(&local_14,&this->card_state_);
  if (bVar1) {
    ConcreteMachine<(Analyser::Static::AppleII::Target::Model)0,_false>::set_paging<4>
              (this->machine_);
  }
  return;
}

Assistant:

void set_card_paging() {
			const auto previous_state = card_state_;

			// By default apply the CX switch through to $C7FF.
			card_state_.region_C1_C3 = card_state_.region_C4_C8 = switches_.internal_CX_rom;

			// Allow the C3 region to be switched to internal ROM in isolation even if the rest of the
			// first half of the CX region is diabled, if its specific switch is also disabled.
			if(!switches_.internal_CX_rom && !switches_.slot_C3_rom) {
				card_state_.region_C3 = true;
			} else {
				card_state_.region_C3 = card_state_.region_C1_C3;
			}

			// Apply the CX switch to $C800+, but also allow the C8 switch to select that region in isolation.
			card_state_.region_C8_D0 = switches_.internal_CX_rom || switches_.internal_C8_rom;

			if(previous_state != card_state_) {
				machine_.template set_paging<PagingType::CardArea>();
			}
		}